

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v11::detail::format_float<double>
              (double value,int precision,format_specs *specs,bool binary32,buffer<char> *buf)

{
  uint128_fallback y;
  presentation_type pVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  unsigned_long uVar7;
  carrier_uint cVar8;
  uint64_t uVar9;
  char *pcVar10;
  buffer<char> *in_RCX;
  byte in_DL;
  basic_specs *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  basic_fp<unsigned___int128> f;
  int i;
  uint32_t fractional_part_1;
  uint32_t third_subsegment;
  uint32_t second_subsegment;
  uint32_t fractional_part;
  anon_class_24_3_5eee03a8 print_subsegment;
  int number_of_digits_to_print;
  bool should_round_up;
  uint32_t digits;
  uint64_t prod;
  uint64_t second_third_subsegments;
  uint32_t first_subsegment;
  uint128_fallback r;
  int digits_in_the_first_segment;
  bool has_more_segments;
  uint64_t first_segment;
  int beta;
  int k;
  int shift;
  int exponent;
  uint64_t significand;
  uint64_t significand_mask;
  unsigned_long br;
  uint dragon_flags;
  bool use_dragon;
  int exp;
  bool fixed;
  convert_float_result<double> converted_value;
  int *in_stack_000001f0;
  buffer<char> *in_stack_000001f8;
  int in_stack_00000200;
  uint in_stack_00000204;
  basic_fp<unsigned___int128> in_stack_00000210;
  char *in_stack_fffffffffffffe18;
  buffer<char> *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  int iVar11;
  int *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  buffer<char> *in_stack_fffffffffffffe40;
  byte local_1b3;
  byte local_1b2;
  byte local_1b1;
  bool local_1a9;
  int in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5c;
  byte in_stack_fffffffffffffe5d;
  byte in_stack_fffffffffffffe5e;
  byte in_stack_fffffffffffffe5f;
  uint in_stack_fffffffffffffe60;
  uint uVar12;
  undefined3 uVar13;
  undefined4 in_stack_fffffffffffffe64;
  size_t local_160;
  char *local_128;
  buffer<char> *local_120;
  int local_104;
  uint local_100;
  uint local_fc;
  int local_f8;
  uint local_f4;
  int *local_f0;
  uint *local_e8;
  uint *local_e0;
  int local_d4;
  bool local_cd;
  uint local_cc;
  uint local_c8 [2];
  ulong local_c0;
  uint local_b4;
  uint128_fallback local_b0;
  uint128_fallback local_a0;
  int local_90;
  byte local_89;
  ulong local_88;
  int local_80;
  int local_7c;
  bool local_75;
  int local_74;
  bool local_6d;
  int local_6c;
  ulong local_68;
  undefined8 local_60;
  double local_58;
  unsigned_long local_50;
  uint local_48;
  byte local_41;
  int local_40;
  undefined1 local_3a;
  byte local_39;
  convert_float_result<double> local_38;
  buffer<char> *local_30;
  byte local_21;
  basic_specs *local_20;
  int local_14;
  double local_10;
  int local_4;
  
  iVar11 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_21 = in_DL & 1;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_14 = in_EDI;
  local_10 = in_XMM0_Qa;
  local_38 = convert_float<double>(in_XMM0_Qa);
  pVar1 = basic_specs::type(local_20);
  local_39 = pVar1 == fixed;
  if ((local_10 != 0.0) || (NAN(local_10))) {
    local_40 = 0;
    local_41 = 1;
    local_48 = 0;
    local_58 = local_10;
    uVar7 = bit_cast<unsigned_long,_double,_0>(&local_58);
    local_60 = 0xfffffffffffff;
    local_68 = uVar7 & 0xfffffffffffff;
    local_50 = uVar7;
    cVar8 = exponent_mask<double>();
    iVar3 = num_significand_bits<double>();
    local_6c = (int)((uVar7 & cVar8) >> ((byte)iVar3 & 0x3f));
    if (local_6c == 0) {
      local_6d = local_68 != 0;
      ignore_unused<bool,char[29]>(&local_6d,(char (*) [29])"zeros should not appear here");
      iVar3 = countl_zero(local_68);
      local_74 = iVar3;
      iVar4 = num_bits<unsigned_long>();
      iVar5 = num_significand_bits<double>();
      local_75 = iVar4 - iVar5 <= iVar3;
      ignore_unused<bool,char[1]>(&local_75,(char (*) [1])0x48171a);
      iVar3 = num_bits<unsigned_long>();
      iVar4 = num_significand_bits<double>();
      local_74 = local_74 - ((iVar3 - iVar4) + -2);
      iVar3 = num_significand_bits<double>();
      local_6c = (-0x3fd - iVar3) - local_74;
      local_68 = local_68 << ((byte)local_74 & 0x3f);
    }
    else {
      iVar3 = exponent_bias<double>();
      iVar4 = num_significand_bits<double>();
      local_6c = local_6c - (iVar3 + iVar4);
      iVar3 = num_significand_bits<double>();
      local_68 = (1L << ((byte)iVar3 & 0x3f) | local_68) << 1;
    }
    local_7c = dragonbox::floor_log10_pow2(0);
    iVar3 = local_6c;
    local_7c = 2 - local_7c;
    local_40 = -local_7c;
    local_80 = dragonbox::floor_log2_pow10(0);
    local_80 = iVar3 + local_80;
    local_b0 = dragonbox::get_cached_power(0);
    y.lo_._4_2_ = in_stack_fffffffffffffe3c;
    y.lo_._0_4_ = in_stack_fffffffffffffe38;
    y.lo_._6_1_ = in_stack_fffffffffffffe3e;
    y.lo_._7_1_ = in_stack_fffffffffffffe3f;
    y.hi_ = (uint64_t)in_stack_fffffffffffffe40;
    local_a0 = dragonbox::umul192_upper128((uint64_t)in_stack_fffffffffffffe30,y);
    local_88 = uint128_fallback::high(&local_a0);
    uVar9 = uint128_fallback::low(&local_a0);
    local_89 = uVar9 != 0;
    if (local_88 < 1000000000000000000) {
      local_90 = 0x12;
      local_88 = local_88 * 10;
    }
    else {
      local_90 = 0x13;
    }
    if ((local_39 & 1) != 0) {
      adjust_precision(in_stack_fffffffffffffe30,iVar11);
    }
    if (local_14 < local_90) {
      local_41 = 0;
      if (local_14 < 1) {
        local_40 = local_90 + local_40;
        if (local_14 < 0) {
          buffer<char>::try_resize(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
        }
        else {
          buffer<char>::try_resize(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
          if ((local_88 | local_89 & 1) < 0x4563918244f40001) {
            pcVar10 = buffer<char>::operator[]<int>(local_30,0);
            *pcVar10 = '0';
          }
          else {
            pcVar10 = buffer<char>::operator[]<int>(local_30,0);
            *pcVar10 = '1';
          }
        }
      }
      else {
        local_40 = (local_90 - local_14) + local_40;
        uVar9 = dragonbox::umul128_upper64(local_88,0x6df37f675ef6eae0);
        local_b4 = (uint)(uVar9 >> 0x20);
        local_c0 = local_88 + (ulong)local_b4 * -10000000000;
        local_d4 = min_of<int>(local_14,9);
        local_f0 = &local_d4;
        local_e8 = local_c8;
        local_e0 = &local_cc;
        buffer<char>::data(local_30);
        format_float<double>::anon_class_24_3_5eee03a8::operator()
                  ((anon_class_24_3_5eee03a8 *)in_stack_fffffffffffffe40,
                   CONCAT13(in_stack_fffffffffffffe3f,
                            CONCAT12(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe3c)),
                   (char *)in_stack_fffffffffffffe30);
        uVar12 = local_c8[0];
        if (local_14 < 10) {
          if (local_14 < 9) {
            local_f4 = local_c8[0];
            uVar6 = fractional_part_rounding_thresholds(8 - local_d4);
            uVar13 = (undefined3)in_stack_fffffffffffffe64;
            in_stack_fffffffffffffe64 = CONCAT13(1,uVar13);
            if (uVar12 < uVar6) {
              in_stack_fffffffffffffe64 =
                   CONCAT13((local_f4 >> 0x1f &
                            (local_cc & 1 | (uint)(local_c0 != 0) | (uint)(local_89 & 1))) != 0,
                            uVar13);
            }
            local_cd = SUB41((uint)in_stack_fffffffffffffe64 >> 0x18,0);
            in_stack_fffffffffffffe60 = uVar12;
          }
          else {
            in_stack_fffffffffffffe5f = 1;
            if (((local_c0 < 0x12a05f201) &&
                (in_stack_fffffffffffffe5e = 0, in_stack_fffffffffffffe5f = 0,
                local_c0 == 5000000000)) &&
               (in_stack_fffffffffffffe5d = 1, in_stack_fffffffffffffe5e = in_stack_fffffffffffffe5d
               , in_stack_fffffffffffffe5f = in_stack_fffffffffffffe5d, (local_cc & 1) == 0)) {
              in_stack_fffffffffffffe5d = local_89;
              in_stack_fffffffffffffe5e = local_89;
              in_stack_fffffffffffffe5f = local_89;
            }
            local_cd = (bool)(in_stack_fffffffffffffe5f & 1);
          }
        }
        else {
          local_c8[0] = uVar12;
          uVar9 = dragonbox::umul128_upper64(local_c0,0x199999999999999a);
          in_stack_fffffffffffffe58 = (int)uVar9;
          local_fc = (int)local_c0 + in_stack_fffffffffffffe58 * -10;
          local_d4 = local_14 + -9;
          local_f8 = in_stack_fffffffffffffe58;
          buffer<char>::data(local_30);
          format_float<double>::anon_class_24_3_5eee03a8::operator()
                    ((anon_class_24_3_5eee03a8 *)in_stack_fffffffffffffe40,
                     CONCAT13(in_stack_fffffffffffffe3f,
                              CONCAT12(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe3c)),
                     (char *)in_stack_fffffffffffffe30);
          if (local_14 < 0x12) {
            local_100 = local_c8[0];
            uVar6 = fractional_part_rounding_thresholds(8 - local_d4);
            local_1a9 = true;
            if (local_c8[0] < uVar6) {
              local_1a9 = (local_100 >> 0x1f &
                          (local_cc & 1 | (uint)(local_fc != 0) | (uint)(local_89 & 1))) != 0;
            }
            local_cd = local_1a9;
          }
          else {
            local_1b1 = 1;
            if (local_fc < 6) {
              local_1b2 = 0;
              if (local_fc == 5) {
                local_1b3 = 1;
                if ((local_cc & 1) == 0) {
                  local_1b3 = local_89;
                }
                local_1b2 = local_1b3;
              }
              local_1b1 = local_1b2;
            }
            local_cd = (bool)(local_1b1 & 1);
          }
        }
        if (local_cd != false) {
          pcVar10 = buffer<char>::operator[]<int>(local_30,local_14 + -1);
          *pcVar10 = *pcVar10 + '\x01';
          local_104 = local_14;
          while( true ) {
            local_104 = local_104 + -1;
            bVar2 = false;
            if (0 < local_104) {
              pcVar10 = buffer<char>::operator[]<int>(local_30,local_104);
              bVar2 = '9' < *pcVar10;
            }
            if (!bVar2) break;
            pcVar10 = buffer<char>::operator[]<int>(local_30,local_104);
            *pcVar10 = '0';
            pcVar10 = buffer<char>::operator[]<int>(local_30,local_104 + -1);
            *pcVar10 = *pcVar10 + '\x01';
          }
          pcVar10 = buffer<char>::operator[]<int>(local_30,0);
          if ('9' < *pcVar10) {
            pcVar10 = buffer<char>::operator[]<int>(local_30,0);
            iVar11 = local_14;
            *pcVar10 = '1';
            if ((local_39 & 1) == 0) {
              local_40 = local_40 + 1;
            }
            else {
              local_14 = local_14 + 1;
              pcVar10 = buffer<char>::operator[]<int>(local_30,iVar11);
              *pcVar10 = '0';
            }
          }
        }
        in_stack_fffffffffffffe40 = local_30;
        to_unsigned<int>(0);
        buffer<char>::try_resize(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
      }
    }
    else {
      local_40 = local_90 + -1 + local_40;
    }
    if ((local_41 & 1) != 0) {
      basic_fp<unsigned___int128>::basic_fp((basic_fp<unsigned___int128> *)&local_128);
      if ((local_21 & 1) == 0) {
        bVar2 = basic_fp<unsigned___int128>::assign<double,_0>
                          ((basic_fp<unsigned___int128> *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           (double)CONCAT17(in_stack_fffffffffffffe5f,
                                            CONCAT16(in_stack_fffffffffffffe5e,
                                                     CONCAT15(in_stack_fffffffffffffe5d,
                                                              CONCAT14(in_stack_fffffffffffffe5c,
                                                                       in_stack_fffffffffffffe58))))
                          );
      }
      else {
        bVar2 = basic_fp<unsigned___int128>::assign<float,_0>
                          ((basic_fp<unsigned___int128> *)in_stack_fffffffffffffe40,
                           (float)CONCAT13(in_stack_fffffffffffffe3f,
                                           CONCAT12(in_stack_fffffffffffffe3e,
                                                    in_stack_fffffffffffffe3c)));
      }
      if (bVar2 != false) {
        local_48 = local_48 | 1;
      }
      if ((local_39 & 1) != 0) {
        local_48 = local_48 | 4;
      }
      if (0x2ff < local_14) {
        local_14 = 0x2ff;
      }
      format_dragon(in_stack_00000210,in_stack_00000204,in_stack_00000200,in_stack_000001f8,
                    in_stack_000001f0);
      in_stack_fffffffffffffe18 = local_128;
      in_stack_fffffffffffffe20 = local_120;
    }
    if (((local_39 & 1) == 0) && (bVar2 = basic_specs::alt(local_20), !bVar2)) {
      local_160 = buffer<char>::size(local_30);
      while( true ) {
        bVar2 = false;
        if (local_160 != 0) {
          pcVar10 = buffer<char>::operator[]<unsigned_long>(local_30,local_160 - 1);
          bVar2 = *pcVar10 == '0';
        }
        if (!bVar2) break;
        local_160 = local_160 - 1;
        local_40 = local_40 + 1;
      }
      buffer<char>::try_resize(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
    }
    local_4 = local_40;
  }
  else if ((local_14 < 1) || (!(bool)local_39)) {
    local_3a = 0x30;
    buffer<char>::push_back(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_4 = 0;
  }
  else {
    to_unsigned<int>(0);
    buffer<char>::try_resize(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
    buffer<char>::data(local_30);
    fill_n<char,int>((char *)in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                     (char)((ulong)in_stack_fffffffffffffe18 >> 0x18));
    local_4 = -local_14;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision,
                                  const format_specs& specs, bool binary32,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  auto converted_value = convert_float(value);

  const bool fixed = specs.type() == presentation_type::fixed;
  if (value == 0) {
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>() || is_constant_evaluated()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    auto e = (f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10;
    exp = static_cast<int>(e);
    if (e > exp) ++exp;  // Compute ceil.
    dragon_flags = dragon::fixup;
  } else {
    // Extract significand bits and exponent bits.
    using info = dragonbox::float_info<double>;
    auto br = bit_cast<uint64_t>(static_cast<double>(value));

    const uint64_t significand_mask =
        (static_cast<uint64_t>(1) << num_significand_bits<double>()) - 1;
    uint64_t significand = (br & significand_mask);
    int exponent = static_cast<int>((br & exponent_mask<double>()) >>
                                    num_significand_bits<double>());

    if (exponent != 0) {  // Check if normal.
      exponent -= exponent_bias<double>() + num_significand_bits<double>();
      significand |=
          (static_cast<uint64_t>(1) << num_significand_bits<double>());
      significand <<= 1;
    } else {
      // Normalize subnormal inputs.
      FMT_ASSERT(significand != 0, "zeros should not appear here");
      int shift = countl_zero(significand);
      FMT_ASSERT(shift >= num_bits<uint64_t>() - num_significand_bits<double>(),
                 "");
      shift -= (num_bits<uint64_t>() - num_significand_bits<double>() - 2);
      exponent = (std::numeric_limits<double>::min_exponent -
                  num_significand_bits<double>()) -
                 shift;
      significand <<= shift;
    }

    // Compute the first several nonzero decimal significand digits.
    // We call the number we get the first segment.
    const int k = info::kappa - dragonbox::floor_log10_pow2(exponent);
    exp = -k;
    const int beta = exponent + dragonbox::floor_log2_pow10(k);
    uint64_t first_segment;
    bool has_more_segments;
    int digits_in_the_first_segment;
    {
      const auto r = dragonbox::umul192_upper128(
          significand << beta, dragonbox::get_cached_power(k));
      first_segment = r.high();
      has_more_segments = r.low() != 0;

      // The first segment can have 18 ~ 19 digits.
      if (first_segment >= 1000000000000000000ULL) {
        digits_in_the_first_segment = 19;
      } else {
        // When it is of 18-digits, we align it to 19-digits by adding a bogus
        // zero at the end.
        digits_in_the_first_segment = 18;
        first_segment *= 10;
      }
    }

    // Compute the actual number of decimal digits to print.
    if (fixed) adjust_precision(precision, exp + digits_in_the_first_segment);

    // Use Dragon4 only when there might be not enough digits in the first
    // segment.
    if (digits_in_the_first_segment > precision) {
      use_dragon = false;

      if (precision <= 0) {
        exp += digits_in_the_first_segment;

        if (precision < 0) {
          // Nothing to do, since all we have are just leading zeros.
          buf.try_resize(0);
        } else {
          // We may need to round-up.
          buf.try_resize(1);
          if ((first_segment | static_cast<uint64_t>(has_more_segments)) >
              5000000000000000000ULL) {
            buf[0] = '1';
          } else {
            buf[0] = '0';
          }
        }
      }  // precision <= 0
      else {
        exp += digits_in_the_first_segment - precision;

        // When precision > 0, we divide the first segment into three
        // subsegments, each with 9, 9, and 0 ~ 1 digits so that each fits
        // in 32-bits which usually allows faster calculation than in
        // 64-bits. Since some compiler (e.g. MSVC) doesn't know how to optimize
        // division-by-constant for large 64-bit divisors, we do it here
        // manually. The magic number 7922816251426433760 below is equal to
        // ceil(2^(64+32) / 10^10).
        const uint32_t first_subsegment = static_cast<uint32_t>(
            dragonbox::umul128_upper64(first_segment, 7922816251426433760ULL) >>
            32);
        const uint64_t second_third_subsegments =
            first_segment - first_subsegment * 10000000000ULL;

        uint64_t prod;
        uint32_t digits;
        bool should_round_up;
        int number_of_digits_to_print = min_of(precision, 9);

        // Print a 9-digits subsegment, either the first or the second.
        auto print_subsegment = [&](uint32_t subsegment, char* buffer) {
          int number_of_digits_printed = 0;

          // If we want to print an odd number of digits from the subsegment,
          if ((number_of_digits_to_print & 1) != 0) {
            // Convert to 64-bit fixed-point fractional form with 1-digit
            // integer part. The magic number 720575941 is a good enough
            // approximation of 2^(32 + 24) / 10^8; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(720575941)) >> 24) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            *buffer = static_cast<char>('0' + digits);
            number_of_digits_printed++;
          }
          // If we want to print an even number of digits from the
          // first_subsegment,
          else {
            // Convert to 64-bit fixed-point fractional form with 2-digits
            // integer part. The magic number 450359963 is a good enough
            // approximation of 2^(32 + 20) / 10^7; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(450359963)) >> 20) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            write2digits(buffer, digits);
            number_of_digits_printed += 2;
          }

          // Print all digit pairs.
          while (number_of_digits_printed < number_of_digits_to_print) {
            prod = static_cast<uint32_t>(prod) * static_cast<uint64_t>(100);
            digits = static_cast<uint32_t>(prod >> 32);
            write2digits(buffer + number_of_digits_printed, digits);
            number_of_digits_printed += 2;
          }
        };

        // Print first subsegment.
        print_subsegment(first_subsegment, buf.data());

        // Perform rounding if the first subsegment is the last subsegment to
        // print.
        if (precision <= 9) {
          // Rounding inside the subsegment.
          // We round-up if:
          //  - either the fractional part is strictly larger than 1/2, or
          //  - the fractional part is exactly 1/2 and the last digit is odd.
          // We rely on the following observations:
          //  - If fractional_part >= threshold, then the fractional part is
          //    strictly larger than 1/2.
          //  - If the MSB of fractional_part is set, then the fractional part
          //    must be at least 1/2.
          //  - When the MSB of fractional_part is set, either
          //    second_third_subsegments being nonzero or has_more_segments
          //    being true means there are further digits not printed, so the
          //    fractional part is strictly larger than 1/2.
          if (precision < 9) {
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (second_third_subsegments != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          // In this case, the fractional part is at least 1/2 if and only if
          // second_third_subsegments >= 5000000000ULL, and is strictly larger
          // than 1/2 if we further have either second_third_subsegments >
          // 5000000000ULL or has_more_segments == true.
          else {
            should_round_up = second_third_subsegments > 5000000000ULL ||
                              (second_third_subsegments == 5000000000ULL &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }
        // Otherwise, print the second subsegment.
        else {
          // Compilers are not aware of how to leverage the maximum value of
          // second_third_subsegments to find out a better magic number which
          // allows us to eliminate an additional shift. 1844674407370955162 =
          // ceil(2^64/10) < ceil(2^64*(10^9/(10^10 - 1))).
          const uint32_t second_subsegment =
              static_cast<uint32_t>(dragonbox::umul128_upper64(
                  second_third_subsegments, 1844674407370955162ULL));
          const uint32_t third_subsegment =
              static_cast<uint32_t>(second_third_subsegments) -
              second_subsegment * 10;

          number_of_digits_to_print = precision - 9;
          print_subsegment(second_subsegment, buf.data() + 9);

          // Rounding inside the subsegment.
          if (precision < 18) {
            // The condition third_subsegment != 0 implies that the segment was
            // of 19 digits, so in this case the third segment should be
            // consisting of a genuine digit from the input.
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (third_subsegment != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          else {
            // In this case, the segment must be of 19 digits, thus
            // the third subsegment should be consisting of a genuine digit from
            // the input.
            should_round_up = third_subsegment > 5 ||
                              (third_subsegment == 5 &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }

        // Round-up if necessary.
        if (should_round_up) {
          ++buf[precision - 1];
          for (int i = precision - 1; i > 0 && buf[i] > '9'; --i) {
            buf[i] = '0';
            ++buf[i - 1];
          }
          if (buf[0] > '9') {
            buf[0] = '1';
            if (fixed)
              buf[precision++] = '0';
            else
              ++exp;
          }
        }
        buf.try_resize(to_unsigned(precision));
      }
    }  // if (digits_in_the_first_segment > precision)
    else {
      // Adjust the exponent for its use in Dragon4.
      exp += digits_in_the_first_segment - 1;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = binary32 ? f.assign(static_cast<float>(value))
                                          : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.alt()) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}